

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O1

int parse_url(char *src_url,int *https,char *host,char *port,char *url)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char str [1024];
  char acStack_438 [1032];
  
  uVar4 = 0;
  memset(acStack_438,0,0x400);
  iVar1 = strncmp(src_url,"http://",7);
  if (iVar1 == 0) {
    pcVar3 = src_url + 7;
  }
  else {
    iVar1 = strncmp(src_url,"https://",8);
    uVar4 = (ulong)(iVar1 == 0);
    pcVar3 = src_url + uVar4 * 8;
  }
  *https = (int)uVar4;
  pcVar2 = strchr(pcVar3,0x2f);
  if (pcVar2 == (char *)0x0) {
    strcpy(acStack_438,pcVar3);
    url[0] = '/';
    url[1] = '\0';
  }
  else {
    strncpy(acStack_438,pcVar3,(long)pcVar2 - (long)pcVar3);
    snprintf(url,0x100,"%s",pcVar2);
  }
  pcVar3 = strchr(acStack_438,0x3a);
  if (pcVar3 == (char *)0x0) {
    iVar1 = snprintf(host,0x100,"%s",acStack_438);
    if (*https == 0) {
      port[2] = '\0';
      port[0] = '8';
      port[1] = '0';
    }
    else {
      builtin_strncpy(port,"443",4);
    }
  }
  else {
    *pcVar3 = '\0';
    snprintf(host,0x100,"%s",acStack_438);
    iVar1 = snprintf(port,5,"%s",pcVar3 + 1);
  }
  return iVar1;
}

Assistant:

static int parse_url(char *src_url, int *https, char *host, char *port, char *url)
{
    char *p1, *p2;
    char str[1024];

    memset(str, 0, 1024);

    if(strncmp(src_url, "http://", 7)==0) {
        p1=&src_url[7];
        *https = 0;
    } else if(strncmp(src_url, "https://", 8)==0) {
        p1=&src_url[8];
        *https = 1;
    } else {
        p1 = &src_url[0];
        *https = 0;
    }

    if((p2=strstr(p1, "/")) == NULL)
    {
        sprintf(str, "%s", p1);
        sprintf(url, "/");
    }
    else
    {
        strncpy(str, p1, p2-p1);
        snprintf(url, 256, "%s", p2);
    }

    if((p1=strstr(str, ":")) != NULL)
    {
        *p1=0;
        snprintf(host, 256, "%s", str);
        snprintf(port, 5, "%s", p1+1);
    }
    else
    {
        snprintf(host, 256, "%s", str);

        if(*https == 0)
            snprintf(port, 5, "80");
        else
            snprintf(port, 5, "443");
    }

    return 0;

}